

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

bool __thiscall Rml::DataInterpreter::Run(DataInterpreter *this)

{
  pointer pIVar1;
  Program *pPVar2;
  pointer pVVar3;
  pointer pVVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  String program_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  size_t next_instruction;
  String local_50;
  
  uVar9 = 0;
  do {
    uVar7 = uVar9;
    pIVar1 = (this->program->
             super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar6 = ((long)(this->program->
                   super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pIVar1) / 0x30;
    if (uVar6 <= uVar7) {
      pVVar3 = (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl
               .super__Vector_impl_data._M_start;
      pVVar4 = (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if (pVVar3 != pVVar4) {
        Log::Message(LT_WARNING,
                     "Possible data interpreter stack corruption. Stack size is %zu at end of execution (should be zero)."
                     ,((long)pVVar4 - (long)pVVar3) / 0x28);
      }
      goto LAB_00261c12;
    }
    next_instruction = uVar7 + 1;
    pIVar1 = pIVar1 + uVar7;
    bVar5 = Execute(this,pIVar1->instruction,&pIVar1->data,&next_instruction);
    uVar9 = next_instruction;
  } while (bVar5);
  pPVar2 = this->program;
  program_str._M_dataplus._M_p = (pointer)&program_str.field_2;
  program_str._M_string_length = 0;
  program_str.field_2._M_local_buf[0] = '\0';
  lVar8 = 8;
  uVar9 = 0;
  while( true ) {
    pIVar1 = (pPVar2->
             super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(pPVar2->
                       super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1) / 0x30) <= uVar9)
    break;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    Variant::Get<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &next_instruction,(Variant *)((pIVar1->data).data + lVar8 + 0xfffffffffffffff0),
               &local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
    CreateString_abi_cxx11_
              (&local_50,"  %4zu  \'%c\'  %s\n",uVar9,
               (ulong)(uint)(int)(((pPVar2->
                                   super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->data).data
                                 [lVar8 + 0xffffffffffffffe8],next_instruction);
    ::std::__cxx11::string::append((string *)&program_str);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&next_instruction);
    uVar9 = uVar9 + 1;
    lVar8 = lVar8 + 0x30;
  }
  Log::Message(LT_WARNING,"Failed to execute program with %zu instructions:",
               ((long)(this->program->
                      super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->program->
                     super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 0x30);
  Log::Message(LT_WARNING,"%s",program_str._M_dataplus._M_p);
  ::std::__cxx11::string::~string((string *)&program_str);
LAB_00261c12:
  return uVar6 <= uVar7;
}

Assistant:

bool Run()
	{
		bool success = true;
		size_t i = 0;
		while (i < program.size())
		{
			size_t next_instruction = i + 1;
			if (!Execute(program[i].instruction, program[i].data, next_instruction))
			{
				success = false;
				break;
			}
			i = next_instruction;
		}

		if (success && !stack.empty())
			Log::Message(Log::LT_WARNING, "Possible data interpreter stack corruption. Stack size is %zu at end of execution (should be zero).",
				stack.size());

		if (!success)
		{
			String program_str = DumpProgram(program);
			Log::Message(Log::LT_WARNING, "Failed to execute program with %zu instructions:", program.size());
			Log::Message(Log::LT_WARNING, "%s", program_str.c_str());
		}

		return success;
	}